

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1495::run(TestCase1495 *this)

{
  Builder builder_00;
  bool bVar1;
  Builder root;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5dc,ERROR,"\"failed: expected \" \"!(root.hasTextField())\"",
               (char (*) [40])"failed: expected !(root.hasTextField())");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5dd,ERROR,"\"failed: expected \" \"!(root.hasDataField())\"",
               (char (*) [40])"failed: expected !(root.hasDataField())");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5de,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5df,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\"",
               (char (*) [40])"failed: expected !(root.hasInt32List())");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField(&local_128);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e1,ERROR,"\"failed: expected \" \"!(root.asReader().hasTextField())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasTextField())");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField(&local_128);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e2,ERROR,"\"failed: expected \" \"!(root.asReader().hasDataField())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasDataField())");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField(&local_128);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e3,ERROR,"\"failed: expected \" \"!(root.asReader().hasStructField())\"",
               (char (*) [53])"failed: expected !(root.asReader().hasStructField())");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List(&local_128);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e4,ERROR,"\"failed: expected \" \"!(root.asReader().hasInt32List())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasInt32List())");
  }
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e8,ERROR,"\"failed: expected \" \"root.hasTextField()\"",
               (char (*) [37])"failed: expected root.hasTextField()");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e9,ERROR,"\"failed: expected \" \"root.hasDataField()\"",
               (char (*) [37])"failed: expected root.hasDataField()");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ea,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5eb,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField(&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ed,ERROR,"\"failed: expected \" \"root.asReader().hasTextField()\"",
               (char (*) [48])"failed: expected root.asReader().hasTextField()");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField(&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ee,ERROR,"\"failed: expected \" \"root.asReader().hasDataField()\"",
               (char (*) [48])"failed: expected root.asReader().hasDataField()");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField(&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[50]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ef,ERROR,"\"failed: expected \" \"root.asReader().hasStructField()\"",
               (char (*) [50])"failed: expected root.asReader().hasStructField()");
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List(&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f0,ERROR,"\"failed: expected \" \"root.asReader().hasInt32List()\"",
               (char (*) [48])"failed: expected root.asReader().hasInt32List()");
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}